

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Decoration __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::TranslateInterpolationDecoration
          (TGlslangToSpvTraverser *this,TQualifier *qualifier)

{
  ulong uVar1;
  Decoration DVar2;
  
  uVar1 = *(ulong *)&qualifier->field_0x8;
  DVar2 = DecorationMax;
  if ((((((uint)uVar1 >> 0x1e & 1) == 0) &&
       (DVar2 = DecorationNoPerspective, (uVar1 >> 0x25 & 1) == 0)) &&
      (DVar2 = DecorationFlat, -1 < (int)(uint)uVar1)) &&
     (DVar2 = DecorationMax, (uVar1 >> 0x26 & 1) != 0)) {
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    DVar2 = DecorationExplicitInterpAMD;
  }
  return DVar2;
}

Assistant:

spv::Decoration TGlslangToSpvTraverser::TranslateInterpolationDecoration(const glslang::TQualifier& qualifier)
{
    if (qualifier.smooth)
        // Smooth decoration doesn't exist in SPIR-V 1.0
        return spv::DecorationMax;
    else if (qualifier.isNonPerspective())
        return spv::DecorationNoPerspective;
    else if (qualifier.flat)
        return spv::DecorationFlat;
    else if (qualifier.isExplicitInterpolation()) {
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::DecorationExplicitInterpAMD;
    }
    else
        return spv::DecorationMax;
}